

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

protocol_descriptor * libtorrent::dht::node::map_protocol_to_descriptor(udp protocol)

{
  array<libtorrent::dht::node::protocol_descriptor,_2UL> *paVar1;
  
  if (map_protocol_to_descriptor(libtorrent::udp)::descriptors == '\0') {
    map_protocol_to_descriptor();
  }
  paVar1 = (array<libtorrent::dht::node::protocol_descriptor,_2UL> *)
           (map_protocol_to_descriptor::descriptors._M_elems + 1);
  if (map_protocol_to_descriptor::descriptors._M_elems[1].protocol.super_udp.family_ !=
      protocol.super_udp.family_) {
    paVar1 = (array<libtorrent::dht::node::protocol_descriptor,_2UL> *)
             &map_protocol_to_descriptor(libtorrent::udp)::descriptors;
  }
  if (map_protocol_to_descriptor::descriptors._M_elems[0].protocol.super_udp.family_ ==
      protocol.super_udp.family_) {
    paVar1 = &map_protocol_to_descriptor::descriptors;
  }
  if (paVar1->_M_elems !=
      (protocol_descriptor *)&map_protocol_to_descriptor(libtorrent::udp)::descriptors) {
    return paVar1->_M_elems;
  }
  aux::throw_ex<std::out_of_range,char_const(&)[17]>((char (*) [17])"unknown protocol");
}

Assistant:

node::protocol_descriptor const& node::map_protocol_to_descriptor(udp const protocol)
{
	static std::array<protocol_descriptor, 2> const descriptors =
	{{
		{udp::v4(), "n4", "nodes"},
		{udp::v6(), "n6", "nodes6"}
	}};

	auto const iter = std::find_if(descriptors.begin(), descriptors.end()
		, [&protocol](protocol_descriptor const& d) { return d.protocol == protocol; });

	if (iter == descriptors.end())
	{
		TORRENT_ASSERT_FAIL();
		aux::throw_ex<std::out_of_range>("unknown protocol");
	}

	return *iter;
}